

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_insn_decoder.c
# Opt level: O2

int event_pending(pt_insn_decoder *decoder)

{
  int iVar1;
  
  if ((decoder->field_0xb00 & 2) == 0) {
    if ((decoder->status & 1) == 0) {
      return 0;
    }
    iVar1 = pt_qry_event(&decoder->query,&decoder->event,0x48);
    if (iVar1 < 0) {
      return iVar1;
    }
    decoder->field_0xb00 = decoder->field_0xb00 | 2;
    decoder->status = iVar1;
  }
  return 1;
}

Assistant:

static inline int event_pending(struct pt_insn_decoder *decoder)
{
	int status;

	if (!decoder)
		return -pte_invalid;

	if (decoder->process_event)
		return 1;

	status = decoder->status;
	if (!(status & pts_event_pending))
		return 0;

	status = pt_qry_event(&decoder->query, &decoder->event,
			      sizeof(decoder->event));
	if (status < 0)
		return status;

	decoder->process_event = 1;
	decoder->status = status;
	return 1;
}